

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

void lyd_hash_keyless_list_dfs(lyd_node *child,uint32_t *hash)

{
  LYS_NODE LVar1;
  uint32_t uVar2;
  int iVar3;
  
  do {
    if (child == (lyd_node *)0x0) {
      return;
    }
    LVar1 = child->schema->nodetype;
    if (((LVar1 == LYS_ANYDATA) || (LVar1 == LYS_LEAF)) || (LVar1 == LYS_LEAFLIST)) {
LAB_0015ed94:
      uVar2 = dict_hash_multi(*hash,(char *)&child->hash,4);
      *hash = uVar2;
    }
    else {
      if (LVar1 == LYS_LIST) {
        iVar3 = lyd_list_has_keys(child);
        if (iVar3 == 0) goto LAB_0015edbe;
      }
      else {
        if (LVar1 == LYS_ANYXML) goto LAB_0015ed94;
        if (LVar1 != LYS_CONTAINER) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                        ,0x156,"void lyd_hash_keyless_list_dfs(struct lyd_node *, uint32_t *)");
        }
      }
      lyd_hash_keyless_list_dfs(child->child,hash);
    }
LAB_0015edbe:
    child = child->next;
  } while( true );
}

Assistant:

static void
lyd_hash_keyless_list_dfs(struct lyd_node *child, uint32_t *hash)
{
    LY_TREE_FOR(child, child) {
        switch (child->schema->nodetype) {
        case LYS_CONTAINER:
            lyd_hash_keyless_list_dfs(child->child, hash);
            break;
        case LYS_LIST:
            /* ignore lists with missing keys */
            if (lyd_list_has_keys(child)) {
                lyd_hash_keyless_list_dfs(child->child, hash);
            }
            break;
        case LYS_LEAFLIST:
        case LYS_ANYXML:
        case LYS_ANYDATA:
        case LYS_LEAF:
            *hash = dict_hash_multi(*hash, (char *)&child->hash, sizeof child->hash);
            break;
        default:
            assert(0);
        }
    }
}